

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckOperator.cxx
# Opt level: O3

bool __thiscall
kws::Parser::CheckOperator
          (Parser *this,uint before,uint after,unsigned_long maxSize,
          bool doNotCheckInsideParenthesis)

{
  string *psVar1;
  size_type sVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  char *__s;
  size_t pos;
  long lVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  undefined7 in_register_00000081;
  bool bVar15;
  Error error;
  undefined1 *local_90;
  char *local_88;
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  this->m_TestsDone[0x17] = true;
  psVar1 = this->m_TestsDescription + 0x17;
  std::__cxx11::string::_M_replace
            ((ulong)psVar1,0,(char *)this->m_TestsDescription[0x17]._M_string_length,0x176a64);
  __s = (char *)operator_new__(10);
  snprintf(__s,10,"%d",(ulong)before);
  std::__cxx11::string::append((char *)psVar1);
  snprintf(__s,10,", after=%d",(ulong)after);
  std::__cxx11::string::append((char *)psVar1);
  operator_delete__(__s);
  bVar3 = FindOperator(this,"==",before,after,maxSize,doNotCheckInsideParenthesis);
  bVar4 = FindOperator(this,"!=",before,after,maxSize,doNotCheckInsideParenthesis);
  bVar5 = FindOperator(this,"-=",before,after,maxSize,doNotCheckInsideParenthesis);
  bVar6 = FindOperator(this,"/=",before,after,maxSize,doNotCheckInsideParenthesis);
  bVar7 = FindOperator(this,"+=",before,after,maxSize,doNotCheckInsideParenthesis);
  bVar8 = FindOperator(this,"*=",before,after,maxSize,doNotCheckInsideParenthesis);
  psVar1 = &this->m_BufferNoComment;
  pos = std::__cxx11::string::find((char *)psVar1,0x176aa9,0);
  if ((int)CONCAT71(in_register_00000081,doNotCheckInsideParenthesis) == 0) {
LAB_001549a5:
    lVar11 = std::__cxx11::string::find((char *)psVar1,0x176aa8,0);
    if ((((pos == lVar11 + 1U) ||
         (lVar11 = std::__cxx11::string::find((char *)psVar1,0x176ab4,0), pos == lVar11 + 1U)) ||
        (lVar11 = std::__cxx11::string::find((char *)psVar1,0x176aab,0), pos == lVar11 + 1U)) ||
       ((lVar11 = std::__cxx11::string::find((char *)psVar1,0x176ab1,0), pos == lVar11 + 1U ||
        (lVar11 = std::__cxx11::string::find((char *)psVar1,0x176aa5,0), pos == lVar11 + 1U)))) {
      bVar15 = true;
    }
    else {
      lVar11 = std::__cxx11::string::find((char *)psVar1,0x176e5b,0);
      bVar15 = pos == lVar11 + 9U;
    }
    if (!doNotCheckInsideParenthesis) goto LAB_00154a5d;
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    bVar9 = IsBetweenCharsFast(this,'(',')',pos,false,&local_50);
    bVar15 = true;
    if (!bVar9) goto LAB_001549a5;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
LAB_00154a5d:
  bVar9 = (bVar8 && bVar7) && ((bVar6 && bVar5) && (bVar3 && bVar4));
  if (pos != 0xffffffffffffffff) {
    bVar9 = (!bVar8 || !bVar7) || ((!bVar6 || !bVar5) || (!bVar3 || !bVar4));
    do {
      if (!bVar15) {
        uVar10 = 0;
        uVar13 = 0;
        if (1 < (long)pos) {
          uVar14 = pos + 1;
          uVar12 = 0;
          do {
            uVar13 = uVar12;
            if ((psVar1->_M_dataplus)._M_p[uVar14 - 2] != ' ') break;
            uVar12 = uVar12 + 1;
            uVar14 = uVar14 - 1;
            uVar13 = (uint)pos - 1;
          } while (2 < uVar14);
        }
        sVar2 = (this->m_BufferNoComment)._M_string_length;
        if ((long)(pos + 1) < (long)sVar2) {
          uVar10 = ~(uint)pos + (int)sVar2;
          lVar11 = 0;
          do {
            if ((psVar1->_M_dataplus)._M_p[lVar11 + pos + 1] != ' ') {
              uVar10 = (uint)lVar11;
              break;
            }
            lVar11 = lVar11 + 1;
          } while (~pos + sVar2 != lVar11);
        }
        if ((uVar13 != before) || (uVar10 != after)) {
          local_90 = local_80;
          local_88 = (char *)0x0;
          local_80[0] = 0;
          GetLineNumber(this,pos,true);
          std::__cxx11::string::_M_replace((ulong)&local_90,0,local_88,0x176ab7);
          if (local_90 != local_80) {
            operator_delete(local_90);
          }
          bVar9 = true;
        }
      }
      uVar14 = pos + 1;
      pos = std::__cxx11::string::find((char *)psVar1,0x176aa9,uVar14);
      if (doNotCheckInsideParenthesis) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
        bVar3 = IsBetweenCharsFast(this,'(',')',pos,false,&local_70);
        bVar15 = true;
        if (!bVar3) goto LAB_00154be6;
LAB_00154c88:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
      }
      else {
LAB_00154be6:
        lVar11 = std::__cxx11::string::find((char *)psVar1,0x176aa8,uVar14);
        if ((((pos == lVar11 + 1U) ||
             (lVar11 = std::__cxx11::string::find((char *)psVar1,0x176ab4,uVar14),
             pos == lVar11 + 1U)) ||
            (lVar11 = std::__cxx11::string::find((char *)psVar1,0x176aab,uVar14), pos == lVar11 + 1U
            )) || ((lVar11 = std::__cxx11::string::find((char *)psVar1,0x176ab1,uVar14),
                   pos == lVar11 + 1U ||
                   (lVar11 = std::__cxx11::string::find((char *)psVar1,0x176aa5,uVar14),
                   pos == lVar11 + 1U)))) {
          bVar15 = true;
        }
        else {
          lVar11 = std::__cxx11::string::find((char *)psVar1,0x176e5b,uVar14);
          bVar15 = pos == lVar11 + 8U;
        }
        if (doNotCheckInsideParenthesis) goto LAB_00154c88;
      }
    } while (pos != 0xffffffffffffffff);
    bVar9 = (bool)(bVar9 ^ 1);
  }
  return bVar9;
}

Assistant:

bool Parser::CheckOperator(unsigned int before, unsigned int after,
                           unsigned long maxSize,
                           bool doNotCheckInsideParenthesis)
{
  m_TestsDone[OPERATOR] = true;
  m_TestsDescription[OPERATOR] = "Number of spaces for the operators should be: before=";
  constexpr size_t length = 10;
  char* val = new char[length];
  snprintf(val,length,"%d",before);
  m_TestsDescription[OPERATOR] += val;  
  snprintf(val,length,", after=%d",after);
  m_TestsDescription[OPERATOR] += val;
  delete [] val;

  bool hasErrors = false;

  if(!this->FindOperator("==",before,after,maxSize,doNotCheckInsideParenthesis))
    {
    hasErrors = true;
    }
  
  if(!this->FindOperator("!=",before,after,maxSize,doNotCheckInsideParenthesis))
    {
    hasErrors = true;
    }

  if(!this->FindOperator("-=",before,after,maxSize,doNotCheckInsideParenthesis))
    {
    hasErrors = true;
    }

  if(!this->FindOperator("/=",before,after,maxSize,doNotCheckInsideParenthesis))
    {
    hasErrors = true;
    }

  if(!this->FindOperator("+=",before,after,maxSize,doNotCheckInsideParenthesis))
    {
    hasErrors = true;
    }

  if(!this->FindOperator("*=",before,after,maxSize,doNotCheckInsideParenthesis))
    {
    hasErrors = true;
    }

  // We check the = operator but we want to make sure that it is not part
  // of the previous defined operator
  bool doNotCheck = false;
  size_t operatorPos = m_BufferNoComment.find("=",0);

  if( (doNotCheckInsideParenthesis && this->IsBetweenCharsFast('(',')',operatorPos,false)) 
    || (operatorPos == m_BufferNoComment.find("!=",0)+1)
    || (operatorPos == m_BufferNoComment.find("*=",0)+1)
    || (operatorPos == m_BufferNoComment.find("-=",0)+1)
    || (operatorPos == m_BufferNoComment.find("+=",0)+1)
    || (operatorPos == m_BufferNoComment.find("==",0)+1)
    || (operatorPos == m_BufferNoComment.find("operator",0)+9)
    )
    {
    doNotCheck = true;
    }

  while(operatorPos != std::string::npos) 
    {
    if(!doNotCheck)
      {
      // Check number of space before
      unsigned int bef = 0;
      long int i = static_cast<long int>(operatorPos)-1;
      while((i>0) && (m_BufferNoComment[i] == ' '))
        {
        bef++;
        i--;
        }

      // Check number of space after
      unsigned int aft = 0;
      i = static_cast<long int>(operatorPos)+1;
      while((i<(long int)m_BufferNoComment.size()) && (m_BufferNoComment[i] == ' '))
        {
        aft++;
        i++;
        }

      if(bef != before || aft != after)
        {
        Error error;
        error.line = this->GetLineNumber(operatorPos,true);
        error.line2 = error.line;
        error.number = OPERATOR;
        error.description = "Spaces around operator are wrong";
        //m_ErrorList.push_back(error);
        hasErrors = true;
        }
      }

    doNotCheck = false;
    size_t tmpoperatorPos = m_BufferNoComment.find("=",operatorPos+1);

    if( (doNotCheckInsideParenthesis && this->IsBetweenCharsFast('(',')',tmpoperatorPos,false)) 
    ||  (tmpoperatorPos == m_BufferNoComment.find("!=",operatorPos+1)+1)
    || (tmpoperatorPos == m_BufferNoComment.find("*=",operatorPos+1)+1)
    || (tmpoperatorPos == m_BufferNoComment.find("-=",operatorPos+1)+1)
    || (tmpoperatorPos == m_BufferNoComment.find("+=",operatorPos+1)+1)
    || (tmpoperatorPos == m_BufferNoComment.find("==",operatorPos+1)+1)
    || (tmpoperatorPos == m_BufferNoComment.find("operator",operatorPos+1)+8)
    )
      {
      doNotCheck = true;
      }

    operatorPos = tmpoperatorPos;
      
    }
  

  return !hasErrors;
}